

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvnc.cpp
# Opt level: O0

int __thiscall QVncServer::init(QVncServer *this,EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  QTcpServer *this_00;
  QString *t;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  int line;
  QObject *this_01;
  char *in_stack_ffffffffffffff58;
  QTcpServer *this_02;
  QObject local_78 [8];
  char local_70 [8];
  char *in_stack_ffffffffffffff98;
  QDebug local_18;
  QHostAddress local_10 [8];
  long local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QTcpServer *)operator_new(0x10);
  QTcpServer::QTcpServer(this_00,&this->super_QObject);
  this->serverSocket = this_00;
  this_02 = this->serverSocket;
  QHostAddress::QHostAddress(local_10,Any);
  bVar1 = QTcpServer::listen((QHostAddress *)this_02,(ushort)local_10);
  QHostAddress::~QHostAddress(local_10);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,in_stack_ffffffffffffff58,line,in_stack_ffffffffffffff48);
    QMessageLogger::warning(local_70,"QVncServer created on port %d",(ulong)this->m_port);
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,in_stack_ffffffffffffff58,line,in_stack_ffffffffffffff48);
    QMessageLogger::warning();
    t = (QString *)QDebug::operator<<((QDebug *)this_02,in_stack_ffffffffffffff98);
    QTcpServer::errorString();
    QDebug::operator<<((QDebug *)this_00,t);
    QString::~QString((QString *)0x10e4ee);
    QDebug::~QDebug(&local_18);
  }
  this_01 = local_78;
  QObject::connect(this_01,(char *)this->serverSocket,(QObject *)"2newConnection()",(char *)this,
                   0x12a2b5);
  QMetaObject::Connection::~Connection((Connection *)this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QVncServer::init()
{
    serverSocket = new QTcpServer(this);
    if (!serverSocket->listen(QHostAddress::Any, m_port))
        qWarning() << "QVncServer could not connect:" << serverSocket->errorString();
    else
        qWarning("QVncServer created on port %d", m_port);

    connect(serverSocket, SIGNAL(newConnection()), this, SLOT(newConnection()));

}